

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::updateOkButton(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  QDialogButtonBox *this_01;
  QFileSystemModel *pQVar1;
  qsizetype qVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  QWidget *this_02;
  QWidgetData *pQVar6;
  bool enable;
  char16_t *tmp_2;
  longlong __tmp;
  StandardButton which;
  QFileDialogPrivate *pQVar7;
  bool saveAsOnFolder;
  QWidgetData *pQVar8;
  char16_t *tmp_1;
  char16_t *pcVar9;
  QTypedArrayData<char16_t> *tmp;
  long lVar10;
  QArrayData *pQVar11;
  QArrayData *pQVar12;
  QString *file;
  QString *string;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QLatin1String QVar16;
  QStringView QVar17;
  QLatin1String QVar18;
  QStringView QVar19;
  QFileInfo info;
  QWidgetData *local_130;
  QArrayData *local_128;
  char16_t *local_120;
  undefined1 local_108 [8];
  undefined1 *local_100;
  QString local_f8;
  QString local_d8;
  undefined8 local_b8;
  char16_t *pcStack_b0;
  QWidgetData *local_a8;
  QString local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QDialogButtonBox *)((this->qFileDialogUi).d)->buttonBox;
  iVar4 = QFileDialogOptions::acceptMode();
  which = Save;
  if (iVar4 == 0) {
    which = Open;
  }
  this_02 = (QWidget *)QDialogButtonBox::button(this_01,which);
  if (this_02 == (QWidget *)0x0) goto LAB_004e52f6;
  uVar5 = QFileDialogOptions::fileMode();
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::selectedFiles((QStringList *)&local_58,this_00);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  QVar13.m_data = (char *)0x2;
  QVar13.m_size = (qsizetype)&local_78;
  cVar3 = QString::startsWith(QVar13,0x660ba0);
  if ((cVar3 != '\0') ||
     (cVar3 = QString::startsWith((QChar)(char16_t)&local_78,0x5c), qVar2 = local_58.size,
     cVar3 != '\0')) {
    QWidget::setEnabled(this_02,true);
    saveAsOnFolder = false;
    goto LAB_004e52b4;
  }
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    enable = false;
    saveAsOnFolder = false;
    goto LAB_004e52a7;
  }
  if ((undefined1 *)local_78.d.size == (undefined1 *)0x2) {
    QVar14.m_data = local_78.d.ptr;
    QVar14.m_size = 2;
    QVar18.m_data = "..";
    QVar18.m_size = 2;
    cVar3 = QtPrivate::equalStrings(QVar14,QVar18);
    enable = true;
    saveAsOnFolder = true;
    if (cVar3 != '\0') goto LAB_004e52a7;
  }
  switch(uVar5) {
  case 0:
    local_98.d.d = ((local_58.ptr)->d).d;
    local_98.d.ptr = ((local_58.ptr)->d).ptr;
    local_98.d.size = ((local_58.ptr)->d).size;
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_100,(QString *)&local_98);
    local_a8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModel::index((QString *)&local_b8,(int)this->model);
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    cVar3 = QFileInfo::isDir();
    if (cVar3 == '\0') {
      QVar15.m_data = local_98.d.ptr;
      QVar15.m_size = local_98.d.size;
      QtPrivate::lastIndexOf(QVar15,-1,L'/',CaseSensitive);
      QString::mid((longlong)&local_f8,(longlong)&local_98);
      pQVar6 = (QWidgetData *)local_f8.d.size;
      pcVar9 = local_f8.d.ptr;
      pQVar11 = &(local_f8.d.d)->super_QArrayData;
      local_d8.d.d = local_f8.d.d;
      local_d8.d.ptr = local_f8.d.ptr;
      local_d8.d.size = local_f8.d.size;
      QString::mid((longlong)&local_f8,(longlong)&local_98);
      local_128 = &(local_f8.d.d)->super_QArrayData;
      local_120 = local_f8.d.ptr;
      pQVar8 = (QWidgetData *)local_f8.d.size;
    }
    else {
      QFileInfo::canonicalFilePath();
      local_d8.d.d = local_f8.d.d;
      local_d8.d.ptr = local_f8.d.ptr;
      local_d8.d.size = local_f8.d.size;
      local_120 = (char16_t *)0x0;
      local_128 = (QArrayData *)0x0;
      pQVar6 = (QWidgetData *)local_f8.d.size;
      pQVar8 = (QWidgetData *)0x0;
      pcVar9 = local_f8.d.ptr;
      pQVar11 = &(local_f8.d.d)->super_QArrayData;
    }
    QVar16.m_data = (char *)0x2;
    QVar16.m_size = (qsizetype)&local_78;
    lVar10 = QString::indexOf(QVar16,0x6683fe,CaseInsensitive);
    pQVar12 = local_128;
    local_130 = pQVar8;
    if (lVar10 != -1) {
      QFileInfo::canonicalFilePath();
      local_d8.d.d = local_f8.d.d;
      local_d8.d.ptr = local_f8.d.ptr;
      local_d8.d.size = local_f8.d.size;
      local_f8.d.d = (Data *)pQVar11;
      local_f8.d.size = (qsizetype)pQVar6;
      if (pQVar11 != (QArrayData *)0x0) {
        LOCK();
        (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar11,2,0x10);
        }
      }
      QFileInfo::fileName();
      pQVar12 = &(local_f8.d.d)->super_QArrayData;
      local_130 = (QWidgetData *)local_f8.d.size;
      local_f8.d.d = (Data *)local_128;
      local_f8.d.ptr = local_120;
      pQVar6 = (QWidgetData *)local_d8.d.size;
      pcVar9 = local_d8.d.ptr;
      local_f8.d.size = (qsizetype)pQVar8;
      if (local_128 != (QArrayData *)0x0) {
        LOCK();
        (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_128,2,0x10);
          pQVar6 = (QWidgetData *)local_d8.d.size;
          pcVar9 = local_d8.d.ptr;
        }
      }
    }
    QFileDialog::directory((QFileDialog *)local_108);
    QDir::canonicalPath();
    if ((pQVar6 == (QWidgetData *)local_f8.d.size) &&
       (QVar17.m_data = pcVar9, QVar17.m_size = (qsizetype)pQVar6, QVar19.m_data = local_f8.d.ptr,
       QVar19.m_size = (qsizetype)pQVar6, cVar3 = QtPrivate::equalStrings(QVar17,QVar19),
       cVar3 != '\0')) {
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDir::~QDir((QDir *)local_108);
      if (local_130 != (QWidgetData *)0x0) goto LAB_004e51a1;
      saveAsOnFolder = false;
      enable = false;
    }
    else {
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDir::~QDir((QDir *)local_108);
LAB_004e51a1:
      if (local_a8 != (QWidgetData *)0x0 && -1 < (int)((uint)local_b8 | local_b8._4_4_)) {
        cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
        saveAsOnFolder = true;
        enable = true;
        if (cVar3 != '\0') goto LAB_004e5232;
      }
      enable = true;
      if ((((int)(uint)local_b8 < 0) || ((int)local_b8._4_4_ < 0)) ||
         (local_a8 == (QWidgetData *)0x0)) {
        pQVar6 = (QWidgetData *)maxNameLength(&local_d8);
        if ((long)pQVar6 < 0) {
          saveAsOnFolder = false;
          enable = true;
          goto LAB_004e5232;
        }
        enable = local_130 <= pQVar6;
      }
      saveAsOnFolder = false;
    }
LAB_004e5232:
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_100);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case 1:
  case 3:
    lVar10 = qVar2 * 0x18;
    string = local_58.ptr;
    do {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = (QFileDialogPrivate *)this->model;
      QFileSystemModel::index((QString *)&local_98,(int)pQVar7);
      if ((((int)local_98.d.d < 0) || ((long)local_98.d.d < 0)) ||
         ((QWidgetData *)local_98.d.size == (QWidgetData *)0x0)) {
        pQVar1 = this->model;
        getEnvironmentVariable(&local_d8,pQVar7,string);
        QFileSystemModel::index((QString *)&local_b8,(int)pQVar1);
        local_98.d.size = (qsizetype)local_a8;
        local_98.d.d = (Data *)local_b8;
        local_98.d.ptr = pcStack_b0;
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        enable = false;
        saveAsOnFolder = enable;
        if ((((int)local_98.d.d < 0) || ((long)local_98.d.d < 0)) ||
           ((QWidgetData *)local_98.d.size == (QWidgetData *)0x0)) goto LAB_004e52a7;
      }
      cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
      if (cVar3 != '\0') {
        enable = true;
        saveAsOnFolder = enable;
        goto LAB_004e52a7;
      }
      string = string + 1;
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != 0);
    enable = true;
    saveAsOnFolder = false;
    break;
  case 2:
    local_98.d.d = ((local_58.ptr)->d).d;
    local_98.d.ptr = ((local_58.ptr)->d).ptr;
    local_98.d.size = ((local_58.ptr)->d).size;
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = (QFileDialogPrivate *)this->model;
    QFileSystemModel::index((QString *)&local_b8,(int)pQVar7);
    if ((((int)(uint)local_b8 < 0) || ((long)local_b8 < 0)) || (local_a8 == (QWidgetData *)0x0)) {
      pQVar1 = this->model;
      getEnvironmentVariable(&local_f8,pQVar7,&local_98);
      QFileSystemModel::index((QString *)&local_d8,(int)pQVar1);
      local_a8 = (QWidgetData *)local_d8.d.size;
      local_b8 = &(local_d8.d.d)->super_QArrayData;
      pcStack_b0 = local_d8.d.ptr;
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((-1 < (int)(uint)local_b8) && (-1 < (long)local_b8)) && (local_a8 != (QWidgetData *)0x0))
      goto LAB_004e4f18;
LAB_004e4f32:
      enable = false;
    }
    else {
LAB_004e4f18:
      cVar3 = QFileSystemModel::isDir((QModelIndex *)this->model);
      enable = true;
      if (cVar3 == '\0') goto LAB_004e4f32;
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_004e4f65;
  default:
    enable = true;
LAB_004e4f65:
    saveAsOnFolder = false;
  }
LAB_004e52a7:
  QWidget::setEnabled(this_02,enable);
LAB_004e52b4:
  updateOkButtonText(this,saveAsOnFolder);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_004e52f6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButton()
{
    Q_Q(QFileDialog);
    QPushButton *button =  qFileDialogUi->buttonBox->button((q->acceptMode() == QFileDialog::AcceptOpen)
                    ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    if (!button)
        return;
    const QFileDialog::FileMode fileMode = q->fileMode();

    bool enableButton = true;
    bool isOpenDirectory = false;

    const QStringList files = q->selectedFiles();
    QString lineEditText = lineEdit()->text();

    if (lineEditText.startsWith("//"_L1) || lineEditText.startsWith(u'\\')) {
        button->setEnabled(true);
        updateOkButtonText();
        return;
    }

    if (files.isEmpty()) {
        enableButton = false;
    } else if (lineEditText == ".."_L1) {
        isOpenDirectory = true;
    } else {
        switch (fileMode) {
        case QFileDialog::Directory: {
            QString fn = files.first();
            QModelIndex idx = model->index(fn);
            if (!idx.isValid())
                idx = model->index(getEnvironmentVariable(fn));
            if (!idx.isValid() || !model->isDir(idx))
                enableButton = false;
            break;
        }
        case QFileDialog::AnyFile: {
            QString fn = files.first();
            QFileInfo info(fn);
            QModelIndex idx = model->index(fn);
            QString fileDir;
            QString fileName;
            if (info.isDir()) {
                fileDir = info.canonicalFilePath();
            } else {
                fileDir = fn.mid(0, fn.lastIndexOf(u'/'));
                fileName = fn.mid(fileDir.size() + 1);
            }
            if (lineEditText.contains(".."_L1)) {
                fileDir = info.canonicalFilePath();
                fileName = info.fileName();
            }

            if (fileDir == q->directory().canonicalPath() && fileName.isEmpty()) {
                enableButton = false;
                break;
            }
            if (idx.isValid() && model->isDir(idx)) {
                isOpenDirectory = true;
                enableButton = true;
                break;
            }
            if (!idx.isValid()) {
                const long maxLength = maxNameLength(fileDir);
                enableButton = maxLength < 0 || fileName.size() <= maxLength;
            }
            break;
        }
        case QFileDialog::ExistingFile:
        case QFileDialog::ExistingFiles:
            for (const auto &file : files) {
                QModelIndex idx = model->index(file);
                if (!idx.isValid())
                    idx = model->index(getEnvironmentVariable(file));
                if (!idx.isValid()) {
                    enableButton = false;
                    break;
                }
                if (idx.isValid() && model->isDir(idx)) {
                    isOpenDirectory = true;
                    break;
                }
            }
            break;
        default:
            break;
        }
    }

    button->setEnabled(enableButton);
    updateOkButtonText(isOpenDirectory);
}